

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrintValidatorTests.cpp
# Opt level: O2

int testAudioFeatureSoundPrintBasic(void)

{
  bool bVar1;
  ArrayFeatureType *pAVar2;
  FeatureType *this;
  FeatureType *this_00;
  ModelDescription *this_01;
  FeatureDescription *this_02;
  FeatureDescription *this_03;
  ostream *poVar3;
  AudioFeaturePrint *this_04;
  ostream *this_05;
  AudioFeaturePrint_Sound *pAVar4;
  int iVar5;
  char *pcVar6;
  undefined1 auStack_a8 [40];
  Result result;
  Model model;
  
  pAVar2 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar2);
  this = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this,pAVar2);
  pAVar2 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar2);
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_00,pAVar2);
  this_01 = (ModelDescription *)operator_new(0xb0);
  CoreML::Specification::ModelDescription::ModelDescription(this_01);
  this_02 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&this_01->input_);
  this_03 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&this_01->output_);
  CoreML::Specification::FeatureDescription::set_allocated_type(this_02,this);
  CoreML::Specification::FeatureDescription::set_allocated_type(this_03,this_00);
  CoreML::Specification::Model::Model(&model);
  CoreML::Specification::Model::set_allocated_description(&model,this_01);
  CoreML::validate<(MLModelType)2006>(&result,&model);
  bVar1 = CoreML::Result::good(&result);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x29);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((result).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    this_04 = CoreML::Specification::Model::_internal_mutable_audiofeatureprint(&model);
    CoreML::validate<(MLModelType)2006>((Result *)auStack_a8,&model);
    CoreML::Result::operator=(&result,(Result *)auStack_a8);
    std::__cxx11::string::~string((string *)(auStack_a8 + 8));
    bVar1 = CoreML::Result::good(&result);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                              );
      this_05 = (ostream *)std::operator<<(poVar3,":");
      iVar5 = 0x2d;
LAB_00162f16:
      poVar3 = (ostream *)std::ostream::operator<<(this_05,iVar5);
      poVar3 = std::operator<<(poVar3,": error: ");
      pcVar6 = "!((result).good())";
    }
    else {
      CoreML::Specification::CoreMLModels::AudioFeaturePrint::_internal_mutable_sound(this_04);
      CoreML::validate<(MLModelType)2006>((Result *)auStack_a8,&model);
      CoreML::Result::operator=(&result,(Result *)auStack_a8);
      std::__cxx11::string::~string((string *)(auStack_a8 + 8));
      bVar1 = CoreML::Result::good(&result);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                                );
        this_05 = (ostream *)std::operator<<(poVar3,":");
        iVar5 = 0x31;
        goto LAB_00162f16;
      }
      pAVar4 = CoreML::Specification::CoreMLModels::AudioFeaturePrint::_internal_mutable_sound
                         (this_04);
      pAVar4->version_ = 1;
      CoreML::validate<(MLModelType)2006>((Result *)auStack_a8,&model);
      CoreML::Result::operator=(&result,(Result *)auStack_a8);
      std::__cxx11::string::~string((string *)(auStack_a8 + 8));
      bVar1 = CoreML::Result::good(&result);
      iVar5 = 0;
      if (bVar1) goto LAB_00162f57;
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x35);
      poVar3 = std::operator<<(poVar3,": error: ");
      pcVar6 = "(result).good()";
    }
    poVar3 = std::operator<<(poVar3,pcVar6);
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  iVar5 = 1;
LAB_00162f57:
  std::__cxx11::string::~string((string *)&result.m_message);
  CoreML::Specification::Model::~Model(&model);
  return iVar5;
}

Assistant:

int testAudioFeatureSoundPrintBasic() {

    Specification::ArrayFeatureType* inputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_multiarraytype(inputArrayFeatureType);

    Specification::ArrayFeatureType* outputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* outputFeatureType = new Specification::FeatureType();
    outputFeatureType->set_allocated_multiarraytype(outputArrayFeatureType);

    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output->set_allocated_type(outputFeatureType);

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto *p = model.mutable_audiofeatureprint();
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    p->mutable_sound();
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    p->mutable_sound()->set_version(Specification::CoreMLModels::AudioFeaturePrint_Sound_SoundVersion_SOUND_VERSION_1);
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_GOOD(result);
    
    return 0;
}